

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O3

void wallet::ApproximateBestSubset
               (FastRandomContext *insecure_rand,
               vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *groups,
               CAmount *nTotalLower,CAmount *nTargetValue,
               vector<char,_std::allocator<char>_> *vfBest,CAmount *nBest,int max_selection_weight,
               int iterations)

{
  byte bVar1;
  byte bVar2;
  uint64_t uVar3;
  pointer pOVar4;
  pointer pOVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long in_FS_OFFSET;
  vector<char,_std::allocator<char>_> vfIncluded;
  value_type local_59;
  vector<char,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_59 = '\x01';
  std::vector<char,_std::allocator<char>_>::_M_fill_assign
            (vfBest,((long)(groups->
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(groups->
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5,
             &local_59);
  *nBest = *nTotalLower;
  iVar7 = 0;
  do {
    if (*nBest == *nTargetValue) break;
    local_59 = '\0';
    std::vector<char,_std::allocator<char>_>::_M_fill_assign
              (&local_58,
               ((long)(groups->
                      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(groups->
                      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5,&local_59
              );
    pOVar4 = (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
             ._M_impl.super__Vector_impl_data._M_start;
    pOVar5 = (groups->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = 0;
    bVar10 = true;
    iVar11 = 0;
    lVar13 = 0;
    do {
      if (pOVar5 == pOVar4) {
        bVar1 = 0;
        pOVar5 = pOVar4;
      }
      else {
        uVar9 = 1;
        uVar12 = 0;
        bVar1 = 0;
        do {
          if (bVar10) {
            uVar3 = RandomMixin<FastRandomContext>::randbits<1>
                              (&insecure_rand->super_RandomMixin<FastRandomContext>);
            if (uVar3 != 0) {
              pOVar4 = (groups->
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       )._M_impl.super__Vector_impl_data._M_start;
LAB_0024a57e:
              lVar13 = lVar13 + *(long *)((long)&pOVar4[uVar12].m_value +
                                         (ulong)((pOVar4[uVar12].m_subtract_fee_outputs ^ 1) << 5));
              iVar11 = iVar11 + pOVar4[uVar12].m_weight;
              local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12] = '\x01';
              if ((*nTargetValue <= lVar13) && (iVar11 <= max_selection_weight)) {
                if (lVar13 < *nBest) {
                  *nBest = lVar13;
                  std::vector<char,_std::allocator<char>_>::operator=(vfBest,&local_58);
                }
                pOVar5 = (groups->
                         super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                lVar13 = lVar13 - *(long *)((long)&pOVar5[uVar12].m_value +
                                           (ulong)((pOVar5[uVar12].m_subtract_fee_outputs ^ 1) << 5)
                                           );
                iVar11 = iVar11 - pOVar5[uVar12].m_weight;
                local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar12] = '\0';
                bVar1 = 1;
              }
            }
          }
          else if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12] == '\0') goto LAB_0024a57e;
          uVar12 = (ulong)uVar9;
          pOVar4 = (groups->
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pOVar5 = (groups->
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar8 = ((long)pOVar5 - (long)pOVar4 >> 3) * 0x4ec4ec4ec4ec4ec5;
          uVar9 = uVar9 + 1;
        } while (uVar12 <= uVar8 && uVar8 - uVar12 != 0);
      }
      bVar6 = (bool)(bVar2 | bVar1);
      bVar10 = false;
      bVar2 = 1;
    } while (!bVar6);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 1000);
  if (local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void ApproximateBestSubset(FastRandomContext& insecure_rand, const std::vector<OutputGroup>& groups,
                                  const CAmount& nTotalLower, const CAmount& nTargetValue,
                                  std::vector<char>& vfBest, CAmount& nBest, int max_selection_weight, int iterations = 1000)
{
    std::vector<char> vfIncluded;

    // Worst case "best" approximation is just all of the groups.
    vfBest.assign(groups.size(), true);
    nBest = nTotalLower;

    for (int nRep = 0; nRep < iterations && nBest != nTargetValue; nRep++)
    {
        vfIncluded.assign(groups.size(), false);
        CAmount nTotal = 0;
        int selected_coins_weight{0};
        bool fReachedTarget = false;
        for (int nPass = 0; nPass < 2 && !fReachedTarget; nPass++)
        {
            for (unsigned int i = 0; i < groups.size(); i++)
            {
                //The solver here uses a randomized algorithm,
                //the randomness serves no real security purpose but is just
                //needed to prevent degenerate behavior and it is important
                //that the rng is fast. We do not use a constant random sequence,
                //because there may be some privacy improvement by making
                //the selection random.
                if (nPass == 0 ? insecure_rand.randbool() : !vfIncluded[i])
                {
                    nTotal += groups[i].GetSelectionAmount();
                    selected_coins_weight += groups[i].m_weight;
                    vfIncluded[i] = true;
                    if (nTotal >= nTargetValue && selected_coins_weight <= max_selection_weight) {
                        fReachedTarget = true;
                        // If the total is between nTargetValue and nBest, it's our new best
                        // approximation.
                        if (nTotal < nBest)
                        {
                            nBest = nTotal;
                            vfBest = vfIncluded;
                        }
                        nTotal -= groups[i].GetSelectionAmount();
                        selected_coins_weight -= groups[i].m_weight;
                        vfIncluded[i] = false;
                    }
                }
            }
        }
    }
}